

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::ComputeOutputDir(cmTarget *this,string *config,bool implib,string *out)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  TargetType TVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  cmGlobalGenerator *pcVar7;
  bool bVar8;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [8];
  string suffix;
  string local_1e8;
  char *local_1c8;
  char *platforms;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  char *local_128;
  char *outdir;
  string local_118;
  char *local_f8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string propertyNameStr;
  char *propertyName;
  string local_70 [8];
  string targetTypeName;
  string conf;
  bool usesDefaultOutputDir;
  string *out_local;
  bool implib_local;
  string *config_local;
  cmTarget *this_local;
  
  std::__cxx11::string::string((string *)(targetTypeName.field_2._M_local_buf + 8),(string *)config)
  ;
  pcVar4 = GetOutputTargetType(this,implib);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar4,(allocator *)((long)&propertyName + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&propertyName + 3));
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),local_70);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(configUpper.field_2._M_local_buf + 8),"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&targetTypeName.field_2 + 8))
  ;
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,local_70);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar2 = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,(char *)uVar2,(allocator *)((long)&outdir + 7));
  pcVar4 = GetProperty(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&outdir + 7));
  local_f8 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,(char *)propertyNameStr.field_2._8_8_,&local_149);
    pcVar4 = GetProperty(this,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_128 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      TVar3 = GetType(this);
      if (TVar3 == EXECUTABLE) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_170,"EXECUTABLE_OUTPUT_PATH",&local_171);
        pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_170);
        std::__cxx11::string::operator=((string *)out,pcVar4);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
      else {
        TVar3 = GetType(this);
        if (((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
           (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_198,"LIBRARY_OUTPUT_PATH",&local_199);
          pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_198);
          std::__cxx11::string::operator=((string *)out,pcVar4);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
        }
      }
    }
    else {
      std::__cxx11::string::operator=((string *)out,pcVar4);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)out,pcVar4);
    std::__cxx11::string::operator=((string *)(targetTypeName.field_2._M_local_buf + 8),"");
  }
  uVar5 = std::__cxx11::string::empty();
  bVar8 = (uVar5 & 1) != 0;
  if (bVar8) {
    std::__cxx11::string::operator=((string *)out,".");
  }
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)&platforms,out,pcVar4);
  std::__cxx11::string::operator=((string *)out,(string *)&platforms);
  std::__cxx11::string::~string((string *)&platforms);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1e8,"CMAKE_XCODE_EFFECTIVE_PLATFORMS",
               (allocator *)(suffix.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
    pcVar6 = "";
    if (bVar8 && pcVar4 != (char *)0x0) {
      pcVar6 = "$(EFFECTIVE_PLATFORM_NAME)";
    }
    local_1c8 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,pcVar6,&local_211);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    pcVar7 = cmMakefile::GetGlobalGenerator(this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"/",&local_239);
    (*pcVar7->_vptr_cmGlobalGenerator[0xe])
              (pcVar7,local_238,(undefined1 *)((long)&targetTypeName.field_2 + 8),local_210,out);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
  }
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(targetTypeName.field_2._M_local_buf + 8));
  return bVar8;
}

Assistant:

bool cmTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    out = outdir;
    }
  else if(this->GetType() == cmTarget::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmTarget::STATIC_LIBRARY ||
          this->GetType() == cmTarget::SHARED_LIBRARY ||
          this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->Makefile->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    const char *platforms = this->Makefile->GetDefinition(
      "CMAKE_XCODE_EFFECTIVE_PLATFORMS");
    std::string suffix =
      usesDefaultOutputDir && platforms ? "$(EFFECTIVE_PLATFORM_NAME)" : "";
    this->Makefile->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}